

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::TabItemLabelAndCloseButton
               (ImDrawList *draw_list,ImRect *bb,ImGuiTabItemFlags flags,ImVec2 frame_padding,
               char *label,ImGuiID tab_id,ImGuiID close_button_id,bool is_contents_visible)

{
  float fVar1;
  float fVar2;
  ImGuiWindow *pIVar3;
  ImVec2 IVar4;
  ImVec2 IVar5;
  ImVec2 IVar6;
  ImGuiID IVar7;
  ImGuiItemStatusFlags IVar8;
  ImGuiContext *pIVar9;
  bool bVar10;
  bool bVar11;
  float fVar12;
  float fVar13;
  float local_d8;
  float fStack_d4;
  ImVec2 local_b0;
  ImVec2 label_size;
  ImVec2 frame_padding_local;
  ImVec2 local_98;
  ImVec2 local_90;
  ImVec2 unsaved_marker_pos;
  float local_68;
  
  pIVar9 = GImGui;
  bVar10 = false;
  frame_padding_local = frame_padding;
  IVar4 = CalcTextSize(label,(char *)0x0,true,-1.0);
  fVar13 = (bb->Min).x;
  fVar12 = (bb->Max).x;
  if (1.0 < fVar12 - fVar13) {
    fVar1 = (bb->Min).y;
    local_d8 = frame_padding.x;
    fStack_d4 = frame_padding.y;
    fVar12 = fVar12 - local_d8;
    fVar2 = (bb->Max).y;
    label_size = IVar4;
    if ((flags & 1U) != 0) {
      IVar5 = CalcTextSize("*",(char *)0x0,false,-1.0);
      fVar12 = fVar12 - IVar5.x;
      local_68 = IVar4.x;
      unsaved_marker_pos.x = (bb->Min).x + local_d8 + local_68 + 2.0;
      if (fVar12 <= unsaved_marker_pos.x) {
        unsaved_marker_pos.x = fVar12;
      }
      unsaved_marker_pos.y = (float)(int)(pIVar9->FontSize * -0.25) + fStack_d4 + (bb->Min).y;
      local_98.y = (bb->Max).y - fStack_d4;
      local_98.x = (bb->Max).x - local_d8;
      local_b0.x = 0.0;
      local_b0.y = 0.0;
      RenderTextClippedEx(draw_list,&unsaved_marker_pos,&local_98,"*",(char *)0x0,(ImVec2 *)0x0,
                          &local_b0,(ImRect *)0x0);
    }
    local_98.y = fVar1 + fStack_d4;
    local_98.x = fVar13 + local_d8;
    local_90.x = fVar12;
    local_90.y = fVar2;
    if (((close_button_id == 0) ||
        ((!is_contents_visible &&
         ((bb->Max).x - (bb->Min).x < (pIVar9->Style).TabMinWidthForUnselectedCloseButton)))) ||
       ((pIVar9->HoveredId != close_button_id && pIVar9->HoveredId != tab_id &&
        (pIVar9->ActiveId != close_button_id)))) {
      fVar13 = (bb->Max).x + -1.0;
      bVar10 = false;
    }
    else {
      pIVar3 = GImGui->CurrentWindow;
      unsaved_marker_pos = (pIVar3->DC).LastItemRect.Min;
      IVar4 = (pIVar3->DC).LastItemRect.Max;
      IVar5 = (pIVar3->DC).LastItemDisplayRect.Min;
      IVar6 = (pIVar3->DC).LastItemDisplayRect.Max;
      fVar13 = pIVar9->FontSize;
      IVar7 = (pIVar3->DC).LastItemId;
      IVar8 = (pIVar3->DC).LastItemStatusFlags;
      PushStyleVar(10,&frame_padding_local);
      local_b0.y = (bb->Min).y;
      local_b0.x = ((bb->Max).x - (frame_padding_local.x + frame_padding_local.x)) - fVar13;
      bVar10 = CloseButton(close_button_id,&local_b0);
      PopStyleVar(1);
      pIVar3 = GImGui->CurrentWindow;
      (pIVar3->DC).LastItemId = IVar7;
      (pIVar3->DC).LastItemStatusFlags = IVar8;
      (pIVar3->DC).LastItemRect.Min = unsaved_marker_pos;
      (pIVar3->DC).LastItemRect.Max = IVar4;
      (pIVar3->DC).LastItemDisplayRect.Min = IVar5;
      (pIVar3->DC).LastItemDisplayRect.Max = IVar6;
      if ((flags & 4U) == 0) {
        bVar11 = IsMouseClicked(2,false);
        bVar10 = bVar10 || bVar11;
      }
      fVar13 = fVar12 - fVar13;
      fVar12 = fVar13;
    }
    RenderTextEllipsis(draw_list,&local_98,&local_90,fVar12,fVar13,label,(char *)0x0,&label_size);
  }
  return bVar10;
}

Assistant:

bool ImGui::TabItemLabelAndCloseButton(ImDrawList* draw_list, const ImRect& bb, ImGuiTabItemFlags flags, ImVec2 frame_padding, const char* label, ImGuiID tab_id, ImGuiID close_button_id, bool is_contents_visible)
{
    ImGuiContext& g = *GImGui;
    ImVec2 label_size = CalcTextSize(label, NULL, true);
    if (bb.GetWidth() <= 1.0f)
        return false;

    // In Style V2 we'll have full override of all colors per state (e.g. focused, selected)
    // But right now if you want to alter text color of tabs this is what you need to do.
#if 0
    const float backup_alpha = g.Style.Alpha;
    if (!is_contents_visible)
        g.Style.Alpha *= 0.7f;
#endif

    // Render text label (with clipping + alpha gradient) + unsaved marker
    const char* TAB_UNSAVED_MARKER = "*";
    ImRect text_pixel_clip_bb(bb.Min.x + frame_padding.x, bb.Min.y + frame_padding.y, bb.Max.x - frame_padding.x, bb.Max.y);
    if (flags & ImGuiTabItemFlags_UnsavedDocument)
    {
        text_pixel_clip_bb.Max.x -= CalcTextSize(TAB_UNSAVED_MARKER, NULL, false).x;
        ImVec2 unsaved_marker_pos(ImMin(bb.Min.x + frame_padding.x + label_size.x + 2, text_pixel_clip_bb.Max.x), bb.Min.y + frame_padding.y + IM_FLOOR(-g.FontSize * 0.25f));
        RenderTextClippedEx(draw_list, unsaved_marker_pos, bb.Max - frame_padding, TAB_UNSAVED_MARKER, NULL, NULL);
    }
    ImRect text_ellipsis_clip_bb = text_pixel_clip_bb;

    // Close Button
    // We are relying on a subtle and confusing distinction between 'hovered' and 'g.HoveredId' which happens because we are using ImGuiButtonFlags_AllowOverlapMode + SetItemAllowOverlap()
    //  'hovered' will be true when hovering the Tab but NOT when hovering the close button
    //  'g.HoveredId==id' will be true when hovering the Tab including when hovering the close button
    //  'g.ActiveId==close_button_id' will be true when we are holding on the close button, in which case both hovered booleans are false
    bool close_button_pressed = false;
    bool close_button_visible = false;
    if (close_button_id != 0)
        if (is_contents_visible || bb.GetWidth() >= g.Style.TabMinWidthForUnselectedCloseButton)
            if (g.HoveredId == tab_id || g.HoveredId == close_button_id || g.ActiveId == close_button_id)
                close_button_visible = true;
    if (close_button_visible)
    {
        ImGuiItemHoveredDataBackup last_item_backup;
        const float close_button_sz = g.FontSize;
        PushStyleVar(ImGuiStyleVar_FramePadding, frame_padding);
        if (CloseButton(close_button_id, ImVec2(bb.Max.x - frame_padding.x * 2.0f - close_button_sz, bb.Min.y)))
            close_button_pressed = true;
        PopStyleVar();
        last_item_backup.Restore();

        // Close with middle mouse button
        if (!(flags & ImGuiTabItemFlags_NoCloseWithMiddleMouseButton) && IsMouseClicked(2))
            close_button_pressed = true;

        text_pixel_clip_bb.Max.x -= close_button_sz;
    }

    float ellipsis_max_x = close_button_visible ? text_pixel_clip_bb.Max.x : bb.Max.x - 1.0f;
    RenderTextEllipsis(draw_list, text_ellipsis_clip_bb.Min, text_ellipsis_clip_bb.Max, text_pixel_clip_bb.Max.x, ellipsis_max_x, label, NULL, &label_size);

#if 0
    if (!is_contents_visible)
        g.Style.Alpha = backup_alpha;
#endif

    return close_button_pressed;
}